

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

vector<Token,_std::allocator<Token>_> * __thiscall
Tokenizer::getTokens
          (vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,Tokenizer *this,
          TokenizerPosition start,TokenizerPosition end)

{
  undefined8 uVar1;
  _Self __tmp;
  Token tok;
  undefined1 local_98 [64];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (start.it._M_node != end.it._M_node) {
    do {
      uVar1 = *(undefined8 *)
               ((long)&((_List_node_base *)((long)start.it._M_node + 0x10))->_M_prev + 5);
      local_98._16_4_ = (undefined4)((ulong)uVar1 >> 0x18);
      local_98[0x14] = SUB81((ulong)uVar1 >> 0x38,0);
      local_98._0_8_ = ((_List_node_base *)((long)start.it._M_node + 0x10))->_M_next;
      local_98._8_5_ = SUB85(((_List_node_base *)((long)start.it._M_node + 0x10))->_M_prev,0);
      local_98._13_3_ =
           (undefined3)
           ((ulong)((_List_node_base *)((long)start.it._M_node + 0x10))->_M_prev >> 0x28);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)(local_98 + 0x18),
                      (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)&((_List_node_base *)((long)start.it._M_node + 0x20))->_M_prev);
      local_58._M_p = (pointer)&local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,((_List_node_base *)((long)start.it._M_node + 0x50))->_M_next,
                 (long)&((_List_node_base *)((long)start.it._M_node + 0x50))->_M_prev->_M_next +
                 (long)((_List_node_base *)((long)start.it._M_node + 0x50))->_M_next);
      local_98[0x14] = false;
      std::vector<Token,_std::allocator<Token>_>::push_back
                (__return_storage_ptr__,(value_type *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_98 + 0x18));
      start.it._M_node = (iterator)((_List_node_base *)start.it._M_node)->_M_next;
    } while (start.it._M_node != end.it._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Tokenizer::getTokens(TokenizerPosition start, TokenizerPosition end) const
{
	std::vector<Token> result;

	for (auto it = start.it; it != end.it; it++)
	{
		Token tok = *it;
		tok.checked = false;
		result.push_back(tok);
	}

	return result;
}